

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_fire_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int to;
  int iVar3;
  int iVar4;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  int in_R8D;
  int hpch;
  int dice_dam;
  int hp_dam;
  int dam;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  CHAR_DATA *victim;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  void *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  CHAR_DATA *pCVar5;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *ach;
  int in_stack_ffffffffffffffe0;
  CHAR_DATA *victim_00;
  int dam_type;
  
  victim_00 = in_RCX;
  act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
      (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
      (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
      (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
      (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
      (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
      (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  iVar2 = in_RDX->hit / 9;
  to = dice(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  iVar3 = iVar2 + to;
  if (in_RDX->hit < iVar3) {
    iVar3 = in_RDX->hit;
  }
  iVar4 = number_range(in_stack_ffffffffffffffc0,to);
  fire_effect(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094);
  pCVar5 = in_RCX->in_room->people;
  while (ach = pCVar5, ach != (CHAR_DATA *)0x0) {
    pCVar5 = ach->next_in_room;
    bVar1 = is_safe((CHAR_DATA *)CONCAT44(iVar3,iVar4),(CHAR_DATA *)CONCAT44(to,iVar2));
    if ((((!bVar1) || (ach->fighting == (CHAR_DATA *)0x0)) || (ach->fighting == in_RDX)) &&
       ((bVar1 = is_same_group(ach,in_RDX), !bVar1 &&
        (bVar1 = is_immortal((CHAR_DATA *)CONCAT44(to,iVar2)), !bVar1)))) {
      dam_type = (int)((ulong)in_RDX >> 0x20);
      if (ach == in_RCX) {
        bVar1 = saves_spell(hpch,(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),dam_type);
        if (bVar1) {
          fire_effect(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094);
          damage_old(in_RDX,victim_00,in_R8D,in_stack_ffffffffffffffe0,(int)((ulong)in_RCX >> 0x20),
                     SUB81((ulong)in_RCX >> 0x18,0));
        }
        else {
          fire_effect(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094);
          damage_old(in_RDX,victim_00,in_R8D,in_stack_ffffffffffffffe0,(int)((ulong)in_RCX >> 0x20),
                     SUB81((ulong)in_RCX >> 0x18,0));
        }
      }
      else {
        bVar1 = saves_spell(hpch,(CHAR_DATA *)CONCAT44(in_EDI,in_ESI),dam_type);
        if (bVar1) {
          fire_effect(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094);
          damage_old(in_RDX,victim_00,in_R8D,in_stack_ffffffffffffffe0,(int)((ulong)in_RCX >> 0x20),
                     SUB81((ulong)in_RCX >> 0x18,0));
        }
        else {
          fire_effect(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094);
          damage_old(in_RDX,victim_00,in_R8D,in_stack_ffffffffffffffe0,(int)((ulong)in_RCX >> 0x20),
                     SUB81((ulong)in_RCX >> 0x18,0));
        }
      }
    }
  }
  return;
}

Assistant:

void spell_fire_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	CHAR_DATA *vch, *vch_next;
	int dam, hp_dam, dice_dam;
	int hpch;

	act("$n breathes forth a cone of fire.", ch, nullptr, victim, TO_NOTVICT);
	act("$n breathes a cone of hot fire over you!", ch, nullptr, victim, TO_VICT);
	act("You breath forth a cone of fire.", ch, nullptr, nullptr, TO_CHAR);

	hpch = ch->hit / 9;
	dice_dam = dice(level, 5);
	dam = hpch + dice_dam;

	if (dam > ch->hit)
		dam = ch->hit;

	hp_dam = number_range(hpch / 9 + 1, hpch / 5);

	/*
	dice_dam = dice(level,20);

	dam = std::max(hp_dam + dice_dam /10, dice_dam + hp_dam / 10);
	*/

	fire_effect(victim->in_room, level, dam / 2, TARGET_ROOM);

	for (vch = victim->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;
		/*
		if (is_safe_spell(ch,vch,true)
			|| (is_npc(vch) && is_npc(ch) && (ch->fighting != vch || vch->fighting != ch)))
		{
			continue;
		}
		*/

		if (is_safe(ch, vch) && vch->fighting != nullptr && vch->fighting != ch)
			continue;

		if (is_same_group(vch, ch))
			continue;

		if (is_immortal(vch))
			continue;

		if (vch == victim) /* full damage */
		{
			if (saves_spell(level, vch, DAM_FIRE))
			{
				fire_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_FIRE, true);
			}
			else
			{
				fire_effect(vch, level, dam, TARGET_CHAR);
				damage_old(ch, vch, dam, sn, DAM_FIRE, true);
			}
		}
		else /* partial damage */
		{
			if (saves_spell(level - 2, vch, DAM_FIRE))
			{
				fire_effect(vch, level / 4, dam / 8, TARGET_CHAR);
				damage_old(ch, vch, dam / 4, sn, DAM_FIRE, true);
			}
			else
			{
				fire_effect(vch, level / 2, dam / 4, TARGET_CHAR);
				damage_old(ch, vch, dam / 2, sn, DAM_FIRE, true);
			}
		}
	}
}